

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O2

int ReadResponseLineAndHeaders
              (SOCKINFO *info,http_parser_t *parser,int *timeout_secs,int *http_error_code)

{
  membuffer *m;
  bool bVar1;
  parse_status_t pVar2;
  uint uVar3;
  int iVar4;
  char buf [2048];
  
  pVar2 = parser_parse_responseline(parser);
  if (pVar2 == PARSE_OK) {
    bVar1 = false;
  }
  else {
    if (pVar2 != PARSE_INCOMPLETE) {
      return pVar2;
    }
    bVar1 = true;
  }
  m = &(parser->msg).msg;
  do {
    if (!bVar1) {
      pVar2 = parser_parse_headers(parser);
      if (pVar2 == PARSE_INCOMPLETE) {
        bVar1 = true;
      }
      else {
        if (pVar2 != PARSE_OK) {
          return pVar2;
        }
        if (parser->position != POS_ENTITY) {
          return 4;
        }
        bVar1 = false;
      }
      while( true ) {
        if (!bVar1) {
          return 4;
        }
        uVar3 = sock_read(info,buf,0x800,timeout_secs);
        if ((int)uVar3 < 1) break;
        iVar4 = membuffer_append(m,buf,(ulong)uVar3);
        if (iVar4 != 0) {
LAB_0010e1a3:
          parser->http_error_code = 500;
          return 3;
        }
        pVar2 = parser_parse_headers(parser);
        bVar1 = true;
        if (pVar2 != PARSE_INCOMPLETE) {
          if (pVar2 != PARSE_OK) {
            return pVar2;
          }
          bVar1 = false;
          if (parser->position != POS_ENTITY) {
            return 4;
          }
        }
      }
      if (uVar3 != 0) {
        *http_error_code = parser->http_error_code;
        return uVar3;
      }
LAB_0010e1c6:
      *http_error_code = 400;
      return -0x77;
    }
    uVar3 = sock_read(info,buf,0x800,timeout_secs);
    if ((int)uVar3 < 1) {
      if (uVar3 != 0) {
        *http_error_code = parser->http_error_code;
        return uVar3;
      }
      goto LAB_0010e1c6;
    }
    iVar4 = membuffer_append(m,buf,(ulong)uVar3);
    if (iVar4 != 0) goto LAB_0010e1a3;
    pVar2 = parser_parse_responseline(parser);
    bVar1 = false;
    if (pVar2 != PARSE_OK) {
      if (pVar2 != PARSE_INCOMPLETE) {
        return pVar2;
      }
      bVar1 = true;
    }
  } while( true );
}

Assistant:

static int ReadResponseLineAndHeaders(
	/*! Socket information object. */
	SOCKINFO *info,
	/*! HTTP Parser object. */
	http_parser_t *parser,
	/*! Time out value. */
	int *timeout_secs,
	/*! HTTP errror code returned. */
	int *http_error_code)
{
	parse_status_t status;
	int num_read;
	char buf[2 * 1024];
	int done = 0;
	int ret_code = 0;

	/*read response line */
	status = parser_parse_responseline(parser);
	switch (status) {
	case PARSE_OK:
		done = 1;
		break;
	case PARSE_INCOMPLETE:
		done = 0;
		break;
	default:
		/*error */
		return status;
	}
	while (!done) {
		num_read = sock_read(info, buf, sizeof(buf), timeout_secs);
		if (num_read > 0) {
			/* append data to buffer */
			ret_code = membuffer_append(
				&parser->msg.msg, buf, (size_t)num_read);
			if (ret_code != 0) {
				/* set failure status */
				parser->http_error_code =
					HTTP_INTERNAL_SERVER_ERROR;
				return PARSE_FAILURE;
			}
			status = parser_parse_responseline(parser);
			switch (status) {
			case PARSE_OK:
				done = 1;
				break;
			case PARSE_INCOMPLETE:
				done = 0;
				break;
			default:
				/*error */
				return status;
			}
		} else if (num_read == 0) {
			/* partial msg */
			*http_error_code = HTTP_BAD_REQUEST; /* or response */
			return UPNP_E_BAD_HTTPMSG;
		} else {
			*http_error_code = parser->http_error_code;
			return num_read;
		}
	}
	status = parser_parse_headers(parser);
	if ((status == (parse_status_t)PARSE_OK) &&
		(parser->position == (parser_pos_t)POS_ENTITY))
		done = 1;
	else if (status == (parse_status_t)PARSE_INCOMPLETE)
		done = 0;
	else
		/*error */
		return status;
	/*read headers */
	while (!done) {
		num_read = sock_read(info, buf, sizeof(buf), timeout_secs);
		if (num_read > 0) {
			/* append data to buffer */
			ret_code = membuffer_append(
				&parser->msg.msg, buf, (size_t)num_read);
			if (ret_code != 0) {
				/* set failure status */
				parser->http_error_code =
					HTTP_INTERNAL_SERVER_ERROR;
				return PARSE_FAILURE;
			}
			status = parser_parse_headers(parser);
			if (status == (parse_status_t)PARSE_OK &&
				parser->position == (parser_pos_t)POS_ENTITY)
				done = 1;
			else if (status == (parse_status_t)PARSE_INCOMPLETE)
				done = 0;
			else
				/*error */
				return status;
		} else if (num_read == 0) {
			/* partial msg */
			*http_error_code = HTTP_BAD_REQUEST; /* or response */
			return UPNP_E_BAD_HTTPMSG;
		} else {
			*http_error_code = parser->http_error_code;
			return num_read;
		}
	}

	return PARSE_OK;
}